

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O3

pseudo_t dmrC_value_pseudo(dmr_C *C,symbol *type,longlong val)

{
  pseudo_t ppVar1;
  int iVar2;
  undefined1 local_50 [8];
  ptr_list_iter pseudoiter__;
  
  if (type == (symbol *)0x0) {
    iVar2 = 8;
    if ((0xff < (ulong)val) && (iVar2 = 0x10, 0xffff < (ulong)val)) {
      iVar2 = (uint)((ulong)val >> 0x20 != 0) * 0x20 + 0x20;
    }
  }
  else {
    iVar2 = (type->field_14).field_1.normal;
    if (0x40 < iVar2) {
      __assert_fail("size == -1 || size <= (int)(sizeof(long long) * 8)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/linearize.c"
                    ,0x34b,"pseudo_t dmrC_value_pseudo(struct dmr_C *, struct symbol *, long long)")
      ;
    }
  }
  pseudoiter__._16_8_ = C->L->prev + ((uint)val & 0x3f);
  ptrlist_forward_iterator
            ((ptr_list_iter *)local_50,(ptr_list *)*(pseudo_list **)pseudoiter__._16_8_);
  ppVar1 = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)local_50);
  if (ppVar1 != (pseudo_t)0x0) {
    do {
      if (((ppVar1->field_5).sym == (symbol *)val) && (ppVar1->size == iVar2)) {
        return ppVar1;
      }
      ppVar1 = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)local_50);
    } while (ppVar1 != (pseudo_t)0x0);
  }
  ppVar1 = (pseudo_t)dmrC_allocator_allocate(&C->L->pseudo_allocator,0);
  ppVar1->type = PSEUDO_VAL;
  (ppVar1->field_5).value = val;
  ppVar1->size = iVar2;
  ptrlist_add((ptr_list **)pseudoiter__._16_8_,ppVar1,&C->ptrlist_allocator);
  return ppVar1;
}

Assistant:

pseudo_t dmrC_value_pseudo(struct dmr_C *C, struct symbol *type, long long val)
{
	int hash = val & (MAX_VAL_HASH-1);
	struct pseudo_list **list = C->L->prev + hash;
	int size = type ? type->bit_size : dmrC_value_size(val);
	pseudo_t pseudo;

	assert(size == -1 || size <= (int)(sizeof(long long) * 8));

	FOR_EACH_PTR(*list, pseudo) {
		if (pseudo->value == val && pseudo->size == size)
			return pseudo;
	} END_FOR_EACH_PTR(pseudo);

	pseudo = (pseudo_t)dmrC_allocator_allocate(&C->L->pseudo_allocator, 0);
	pseudo->type = PSEUDO_VAL;
	pseudo->value = val;
	pseudo->size = size;
	dmrC_add_pseudo(C, list, pseudo);

	/* Value pseudos have neither nr, usage nor def */
	return pseudo;
}